

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O1

void test_cipher_caesar_with_data(void)

{
  FILE *pFVar1;
  char key [8];
  char result2 [20];
  char result [20];
  char text [20];
  cipher_data data2;
  cipher_data data;
  text_scorer scorer;
  
  pFVar1 = fopen("./english_quadgrams.txt","r");
  scorer_load_data(&stack0xffffffffffe41b90,pFVar1);
  caesar_with_data(&stack0xffffffffffe41b60);
  UnityAssertEqualNumber(1,0,(char *)0x0,0xa9,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("19",&stack0xffffffffffe41ad0,(char *)0x0,0xaa);
  UnityAssertEqualString("THISISACAESARCIPHER",&stack0xffffffffffe41af8,(char *)0x0,0xab);
  caesar_with_data(&stack0xffffffffffe41b30);
  UnityAssertEqualNumber(1,0,(char *)0x0,0xbb,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("THISISACAESARCIPHER",&stack0xffffffffffe41ad8,(char *)0x0,0xbc);
  return;
}

Assistant:

void test_cipher_caesar_with_data(void)
{
	// Load the quadgram data
	struct text_scorer scorer;
	scorer_load_data(&scorer, fopen("./english_quadgrams.txt", "r"));

	// Test autocrack

	char text[] = "AOPZPZHJHLZHYJPWOLY";
	char result[sizeof(text)];
	char key[8];

	struct cipher_data data = {
			.ct = text,
			.key = key,
			.use_autocrack = true,
			.scorer = &scorer,
			.result = result,
	};

	caesar_with_data(&data);

	TEST_ASSERT_EQUAL_INT(true, data.success);
	TEST_ASSERT_EQUAL_STRING("19", data.key);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data.result);

	// Test solve with key

	char result2[sizeof(text)];

	struct cipher_data data2 = {
			.ct = text,
			.key = "19",
			.use_autocrack = false,
			.scorer = &scorer,
			.result = result2,
	};

	caesar_with_data(&data2);

	TEST_ASSERT_EQUAL_INT(true, data2.success);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data2.result);
}